

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

int UnicodeDataComp(void *pnKey,void *elem)

{
  uint uVar1;
  
  if ((int)*pnKey < (int)(uint)*elem) {
    uVar1 = 0xffffffff;
  }
  else {
    uVar1 = (uint)((uint)*(ushort *)((long)elem + 6) + (uint)*elem < *pnKey);
  }
  return uVar1;
}

Assistant:

static int UnicodeDataComp(const void *pnKey, const void *elem)
{
    WCHAR uValue = ((UnicodeDataRec*)elem)->nUnicodeValue;
    WORD  rangeValue = ((UnicodeDataRec*)elem)->rangeValue;

    if (*((INT*)pnKey) < uValue)
    {
        return -1;
    }
    else
    {
        if (*((INT*)pnKey) > (uValue + rangeValue))
        {
            return 1;
        }
        else
        {
            return 0;
        }
    }
}